

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall baseObject::~baseObject(baseObject *this)

{
  baseObject *this_local;
  
  std::vector<bezierPoint,_std::allocator<bezierPoint>_>::~vector(&this->curves);
  std::vector<_point,_std::allocator<_point>_>::~vector(&this->points);
  return;
}

Assistant:

baseObject::~baseObject()
{
}